

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Promise<capnp::AnyPointer::Pipeline> __thiscall
capnp::LocalCallContext::onTailCall(LocalCallContext *this)

{
  SourceLocation location;
  long in_RSI;
  PromiseFulfillerPair<capnp::AnyPointer::Pipeline> paf;
  Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>,_std::nullptr_t> local_48;
  PromiseBase in_stack_ffffffffffffffd0;
  Disposer *in_stack_ffffffffffffffd8;
  PromiseFulfiller<capnp::AnyPointer::Pipeline> *in_stack_ffffffffffffffe0;
  
  location.function = (char *)in_stack_ffffffffffffffd8;
  location.fileName = (char *)in_stack_ffffffffffffffd0.node.ptr;
  location._16_8_ = in_stack_ffffffffffffffe0;
  kj::newPromiseAndFulfiller<capnp::AnyPointer::Pipeline>(location);
  kj::Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>,_std::nullptr_t>::operator=
            ((Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>,_std::nullptr_t> *)
             (in_RSI + 0x90),&local_48);
  kj::Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>,_std::nullptr_t>::dispose(&local_48);
  (this->super_CallContextHook)._vptr_CallContextHook =
       (_func_int **)in_stack_ffffffffffffffd0.node.ptr;
  kj::PromiseFulfillerPair<capnp::AnyPointer::Pipeline>::~PromiseFulfillerPair
            ((PromiseFulfillerPair<capnp::AnyPointer::Pipeline> *)&stack0xffffffffffffffd0);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<AnyPointer::Pipeline> onTailCall() override {
    auto paf = kj::newPromiseAndFulfiller<AnyPointer::Pipeline>();
    tailCallPipelineFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }